

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_mult_xonly(void)

{
  int iVar1;
  secp256k1_scalar q_1;
  int res_1;
  secp256k1_fe r;
  secp256k1_fe d_1;
  secp256k1_fe n_1;
  secp256k1_fe x;
  int res;
  secp256k1_scalar q;
  secp256k1_fe v;
  secp256k1_fe resx;
  secp256k1_fe d;
  secp256k1_fe n;
  secp256k1_gej resj;
  secp256k1_gej basej;
  secp256k1_ge base;
  int i;
  secp256k1_scalar *in_stack_00000528;
  secp256k1_scalar *in_stack_00000530;
  secp256k1_gej *in_stack_00000538;
  secp256k1_gej *in_stack_00000540;
  secp256k1_ge *in_stack_fffffffffffffcf8;
  secp256k1_gej *in_stack_fffffffffffffd00;
  secp256k1_fe *in_stack_fffffffffffffd10;
  secp256k1_ge *in_stack_fffffffffffffd20;
  secp256k1_fe *in_stack_fffffffffffffd48;
  secp256k1_fe *in_stack_fffffffffffffd50;
  secp256k1_gej local_2a0 [2];
  int in_stack_fffffffffffffe6c;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_fe *in_stack_fffffffffffffe78;
  secp256k1_fe *in_stack_fffffffffffffe80;
  secp256k1_fe *in_stack_fffffffffffffe88;
  undefined1 local_60 [92];
  uint local_4;
  
  local_4 = 0;
  while( true ) {
    if (SBORROW4(local_4,COUNT * 2) == (int)(local_4 + COUNT * -2) < 0) {
      local_4 = 0;
      while( true ) {
        if (SBORROW4(local_4,COUNT * 2) == (int)(local_4 + COUNT * -2) < 0) {
          return;
        }
        testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffd20);
        do {
          testutil_random_fe_test(in_stack_fffffffffffffd10);
          iVar1 = secp256k1_ge_x_on_curve_var(&in_stack_fffffffffffffd20->x);
        } while (iVar1 != 0);
        if ((local_4 & 1) == 0) {
          memcpy(&local_2a0[0].y,&local_2a0[0].z,0x28);
        }
        else {
          testutil_random_fe_non_zero_test((secp256k1_fe *)0x13c2e3);
          secp256k1_fe_impl_mul
                    (&in_stack_fffffffffffffd00->x,&in_stack_fffffffffffffcf8->x,
                     (secp256k1_fe *)0x13c2fd);
        }
        if ((local_4 & 1) == 0) {
          in_stack_fffffffffffffd00 = (secp256k1_gej *)0x0;
        }
        else {
          in_stack_fffffffffffffd00 = local_2a0;
        }
        iVar1 = secp256k1_ecmult_const_xonly
                          (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                           in_stack_fffffffffffffe6c);
        if (iVar1 != 0) break;
        local_4 = local_4 + 1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x11e2,"test condition failed: res == 0");
      abort();
    }
    testutil_random_ge_test(in_stack_fffffffffffffd20);
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffd20);
    if ((local_4 & 1) == 0) {
      memcpy(&stack0xfffffffffffffe78,local_60,0x28);
    }
    else {
      testutil_random_fe_non_zero_test((secp256k1_fe *)0x13c0bf);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffd00->x,&in_stack_fffffffffffffcf8->x,
                 (secp256k1_fe *)0x13c0dc);
    }
    local_2a0[0]._124_4_ =
         secp256k1_ecmult_const_xonly
                   (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                    in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    if (local_2a0[0]._124_4_ == 0) break;
    secp256k1_gej_set_ge(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    secp256k1_ecmult(in_stack_00000540,in_stack_00000538,in_stack_00000530,in_stack_00000528);
    secp256k1_fe_impl_sqr(&in_stack_fffffffffffffd00->x,&in_stack_fffffffffffffcf8->x);
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffffd00->x,&in_stack_fffffffffffffcf8->x,(secp256k1_fe *)0x13c209)
    ;
    iVar1 = fe_equal(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x11cd,"test condition failed: fe_equal(&v, &resj.x)");
      abort();
    }
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x11c6,"test condition failed: res");
  abort();
}

Assistant:

static void ecmult_const_mult_xonly(void) {
    int i;

    /* Test correspondence between secp256k1_ecmult_const and secp256k1_ecmult_const_xonly. */
    for (i = 0; i < 2*COUNT; ++i) {
        secp256k1_ge base;
        secp256k1_gej basej, resj;
        secp256k1_fe n, d, resx, v;
        secp256k1_scalar q;
        int res;
        /* Random base point. */
        testutil_random_ge_test(&base);
        /* Random scalar to multiply it with. */
        testutil_random_scalar_order_test(&q);
        /* If i is odd, n=d*base.x for random non-zero d */
        if (i & 1) {
            testutil_random_fe_non_zero_test(&d);
            secp256k1_fe_mul(&n, &base.x, &d);
        } else {
            n = base.x;
        }
        /* Perform x-only multiplication. */
        res = secp256k1_ecmult_const_xonly(&resx, &n, (i & 1) ? &d : NULL, &q, i & 2);
        CHECK(res);
        /* Perform normal multiplication. */
        secp256k1_gej_set_ge(&basej, &base);
        secp256k1_ecmult(&resj, &basej, &q, NULL);
        /* Check that resj's X coordinate corresponds with resx. */
        secp256k1_fe_sqr(&v, &resj.z);
        secp256k1_fe_mul(&v, &v, &resx);
        CHECK(fe_equal(&v, &resj.x));
    }

    /* Test that secp256k1_ecmult_const_xonly correctly rejects X coordinates not on curve. */
    for (i = 0; i < 2*COUNT; ++i) {
        secp256k1_fe x, n, d, r;
        int res;
        secp256k1_scalar q;
        testutil_random_scalar_order_test(&q);
        /* Generate random X coordinate not on the curve. */
        do {
            testutil_random_fe_test(&x);
        } while (secp256k1_ge_x_on_curve_var(&x));
        /* If i is odd, n=d*x for random non-zero d. */
        if (i & 1) {
            testutil_random_fe_non_zero_test(&d);
            secp256k1_fe_mul(&n, &x, &d);
        } else {
            n = x;
        }
        res = secp256k1_ecmult_const_xonly(&r, &n, (i & 1) ? &d : NULL, &q, 0);
        CHECK(res == 0);
    }
}